

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O2

double __thiscall Creature::make_fitness(Creature *this)

{
  pointer psVar1;
  int iVar2;
  World *pWVar3;
  type pCVar4;
  genes_t *pgVar5;
  undefined4 extraout_var;
  ulong chrom;
  ulong gene;
  double dVar6;
  undefined1 auStack_78 [8];
  vector<boost::any,_std::allocator<boost::any>_> av;
  undefined1 local_58 [8];
  shared_ptr<Chromosome> chr;
  double local_40;
  any local_38;
  
  local_40 = 0.0;
  if (this->pntpop != (Population *)0x0) {
    pWVar3 = Population::get_world(this->pntpop);
    if (pWVar3 != (World *)0x0) {
      local_40 = 0.0;
      for (chrom = 0;
          psVar1 = (this->chroms).
                   super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          chrom < (ulong)((long)(this->chroms).
                                super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
          chrom = chrom + 1) {
        local_58 = (undefined1  [8])psVar1[chrom].px;
        chr.px = (element_type *)psVar1[chrom].pn.pi_;
        if (chr.px != (element_type *)0x0) {
          LOCK();
          *(uint_least32_t *)&(chr.px)->CHROMOSOME_SIZE =
               (uint_least32_t)(chr.px)->CHROMOSOME_SIZE + 1;
          UNLOCK();
        }
        gene = 0;
        while( true ) {
          pCVar4 = boost::shared_ptr<Chromosome>::operator->((shared_ptr<Chromosome> *)local_58);
          pgVar5 = Chromosome::get_genes(pCVar4);
          if ((ulong)((long)(pgVar5->
                            super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pgVar5->
                            super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) <= gene) break;
          auStack_78 = (undefined1  [8])0x0;
          av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          chr.pn.pi_ = (sp_counted_base *)get_phenotype(this,chrom,gene,0);
          local_38.content = (placeholder *)operator_new(0x10);
          (local_38.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_001217c0;
          local_38.content[1]._vptr_placeholder = (_func_int **)chr.pn.pi_;
          std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                    ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78,&local_38);
          if (local_38.content != (placeholder *)0x0) {
            (*(local_38.content)->_vptr_placeholder[1])();
          }
          pCVar4 = boost::shared_ptr<Chromosome>::operator->((shared_ptr<Chromosome> *)local_58);
          chr.pn.pi_ = (sp_counted_base *)get_phenotype(this,chrom,gene,pCVar4->ALLELE_SIZE);
          local_38.content = (placeholder *)operator_new(0x10);
          (local_38.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_001217c0;
          local_38.content[1]._vptr_placeholder = (_func_int **)chr.pn.pi_;
          std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                    ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78,&local_38);
          if (local_38.content != (placeholder *)0x0) {
            (*(local_38.content)->_vptr_placeholder[1])();
          }
          iVar2 = (*pWVar3->_vptr_World[6])(pWVar3);
          dVar6 = (double)(*(code *)CONCAT44(extraout_var,iVar2))
                                    ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78);
          local_40 = local_40 + dVar6;
          std::vector<boost::any,_std::allocator<boost::any>_>::~vector
                    ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78);
          gene = gene + 1;
        }
        boost::detail::shared_count::~shared_count((shared_count *)&chr);
      }
    }
  }
  return local_40;
}

Assistant:

double Creature::make_fitness()
{
	if(!pntpop)
		return 0;

	const World* wld = pntpop->get_world();
	if(!wld)
		return 0;

	double ret = 0;

	for(size_t h = 0; h < chroms.size(); ++h)
	{
		boost::shared_ptr<Chromosome> chr = chroms[h];

		for(size_t i = 0; i < chr->get_genes().size(); ++i)
		{
			std::vector<any> av;
			av.push_back(get_phenotype(h, i, 0));
			av.push_back(get_phenotype(h, i, chr->ALLELE_SIZE));

			ret += (wld->get_fitfun())(av);
		}
	}

	return ret;

}